

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O1

ScalarFunction * duckdb::ListAggregateFun::GetFunction(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  ScalarFunction *in_RDI;
  long lVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_199;
  code *local_198;
  undefined8 uStack_190;
  code *local_188;
  code *pcStack_180;
  LogicalType local_170 [8];
  undefined8 local_168;
  undefined8 uStack_160;
  LogicalType local_158 [24];
  LogicalType local_140 [24];
  LogicalType local_128 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_110;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  LogicalType local_e8 [24];
  BaseScalarFunction local_d0 [176];
  
  duckdb::LogicalType::LogicalType(local_128,ANY);
  duckdb::LogicalType::LIST(local_170);
  duckdb::LogicalType::LogicalType(local_158,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_170;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_110,__l,&local_199);
  duckdb::LogicalType::LogicalType(local_140,ANY);
  uStack_190 = 0;
  local_198 = ListAggregateFunction;
  pcStack_180 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_e8,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_e8);
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,3);
  }
  duckdb::LogicalType::~LogicalType(local_140);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_110);
  lVar4 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_170 + lVar4);
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  duckdb::LogicalType::~LogicalType(local_128);
  BaseScalarFunction::SetReturnsError(local_d0,&in_RDI->super_BaseScalarFunction);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_d0);
  in_RDI->field_0xa9 = 1;
  duckdb::LogicalType::LogicalType(local_170,ANY);
  uVar3 = uStack_160;
  uVar2 = local_168;
  in_RDI->field_0x78 = local_170[0];
  in_RDI->field_0x79 = local_170[1];
  uVar5 = *(undefined4 *)&in_RDI->field_0x80;
  uVar7 = *(undefined4 *)&in_RDI->field_0x88;
  *(undefined8 *)&in_RDI->field_0x80 = 0;
  *(undefined8 *)&in_RDI->field_0x88 = 0;
  local_168 = 0;
  uStack_160 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&in_RDI->field_0x88;
  *(undefined8 *)&in_RDI->field_0x80 = uVar2;
  *(undefined8 *)&in_RDI->field_0x88 = uVar3;
  uVar6 = *(undefined4 *)&in_RDI->field_0x84;
  uVar8 = *(undefined4 *)&in_RDI->field_0x8c;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_f8 = uVar5;
    uStack_f4 = *(undefined4 *)&in_RDI->field_0x84;
    uStack_f0 = uVar7;
    uStack_ec = *(undefined4 *)&in_RDI->field_0x8c;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    uVar5 = local_f8;
    uVar6 = uStack_f4;
    uVar7 = uStack_f0;
    uVar8 = uStack_ec;
  }
  p_Var1 = uStack_160;
  local_168 = CONCAT44(uVar6,uVar5);
  uStack_160 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar8,uVar7);
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  duckdb::LogicalType::~LogicalType(local_170);
  in_RDI->serialize = ListAggregatesBindData::SerializeFunction;
  in_RDI->deserialize = ListAggregatesBindData::DeserializeFunction;
  return in_RDI;
}

Assistant:

ScalarFunction ListAggregateFun::GetFunction() {
	auto result =
	    ScalarFunction({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR}, LogicalType::ANY,
	                   ListAggregateFunction, ListAggregateBind, nullptr, nullptr, ListAggregatesInitLocalState);
	BaseScalarFunction::SetReturnsError(result);
	result.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	result.varargs = LogicalType::ANY;
	result.serialize = ListAggregatesBindData::SerializeFunction;
	result.deserialize = ListAggregatesBindData::DeserializeFunction;
	return result;
}